

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

_Bool highbd_upscale_normative_rect
                (uint8_t *input,int height,int width,int in_stride,uint8_t *output,int height2,
                int width2,int out_stride,int x_step_qn,int x0_qn,int pad_left,int pad_right,int bd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int i_3;
  int i_2;
  int i_1;
  int i;
  uint16_t *in_tr;
  uint16_t *in_tl;
  uint16_t *input16;
  uint16_t *tmp_right;
  uint16_t *tmp_left;
  int border_size;
  int border_cols;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  void *local_58;
  void *local_50;
  
  local_50 = (void *)0x0;
  local_58 = (void *)0x0;
  lVar1 = in_RDI * 2;
  lVar2 = lVar1 + -10;
  lVar3 = lVar1 + (long)in_EDX * 2;
  if (i_3 != 0) {
    local_50 = aom_malloc(0x6d56f6);
    if (local_50 == (void *)0x0) {
      return false;
    }
    for (local_74 = 0; local_74 < in_ESI; local_74 = local_74 + 1) {
      *(undefined8 *)((long)local_50 + (long)(local_74 * 5) * 2) =
           *(undefined8 *)(lVar2 + (long)(local_74 * in_ECX) * 2);
      *(undefined2 *)((long)local_50 + (long)(local_74 * 5) * 2 + 8) =
           *(undefined2 *)(lVar1 + -2 + (long)(local_74 * in_ECX) * 2);
      aom_memset16((void *)(lVar2 + (long)(local_74 * in_ECX) * 2),
                   (uint)*(ushort *)(lVar1 + (long)(local_74 * in_ECX) * 2),5);
    }
  }
  if (i_1 != 0) {
    local_58 = aom_malloc(0x6d57b8);
    if (local_58 == (void *)0x0) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      return false;
    }
    for (local_78 = 0; local_78 < in_ESI; local_78 = local_78 + 1) {
      *(undefined8 *)((long)local_58 + (long)(local_78 * 5) * 2) =
           *(undefined8 *)(lVar3 + (long)(local_78 * in_ECX) * 2);
      *(undefined2 *)((long)local_58 + (long)(local_78 * 5) * 2 + 8) =
           *(undefined2 *)(lVar3 + 8 + (long)(local_78 * in_ECX) * 2);
      aom_memset16((void *)(lVar3 + (long)(local_78 * in_ECX) * 2),
                   (uint)*(ushort *)(lVar1 + (long)(local_78 * in_ECX + in_EDX + -1) * 2),5);
    }
  }
  (*av1_highbd_convolve_horiz_rs)
            ((uint16_t *)((in_RDI + -1) * 2),in_ECX,(uint16_t *)(in_R8 << 1),in_stack_00000010,
             in_stack_00000008,in_R9D,av1_resize_filter_normative[0],in_stack_00000020,
             in_stack_00000018,(int)in_tr);
  if (i_3 != 0) {
    for (local_7c = 0; local_7c < in_ESI; local_7c = local_7c + 1) {
      *(undefined8 *)(lVar2 + (long)(local_7c * in_ECX) * 2) =
           *(undefined8 *)((long)local_50 + (long)(local_7c * 5) * 2);
      *(undefined2 *)(lVar1 + -2 + (long)(local_7c * in_ECX) * 2) =
           *(undefined2 *)((long)local_50 + (long)(local_7c * 5) * 2 + 8);
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_00000020));
  }
  if (i_1 != 0) {
    for (local_80 = 0; local_80 < in_ESI; local_80 = local_80 + 1) {
      *(undefined8 *)(lVar3 + (long)(local_80 * in_ECX) * 2) =
           *(undefined8 *)((long)local_58 + (long)(local_80 * 5) * 2);
      *(undefined2 *)(lVar3 + 8 + (long)(local_80 * in_ECX) * 2) =
           *(undefined2 *)((long)local_58 + (long)(local_80 * 5) * 2 + 8);
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_00000020));
  }
  return true;
}

Assistant:

static bool highbd_upscale_normative_rect(const uint8_t *const input,
                                          int height, int width, int in_stride,
                                          uint8_t *output, int height2,
                                          int width2, int out_stride,
                                          int x_step_qn, int x0_qn,
                                          int pad_left, int pad_right, int bd) {
  assert(width > 0);
  assert(height > 0);
  assert(width2 > 0);
  assert(height2 > 0);
  assert(height2 == height);

  // Extend the left/right pixels of the tile column if needed
  // (either because we can't sample from other tiles, or because we're at
  // a frame edge).
  // Save the overwritten pixels into tmp_left and tmp_right.
  // Note: Because we pass input-1 to av1_convolve_horiz_rs, we need one extra
  // column of border pixels compared to what we'd naively think.
  const int border_cols = UPSCALE_NORMATIVE_TAPS / 2 + 1;
  const int border_size = border_cols * sizeof(uint16_t);
  uint16_t *tmp_left =
      NULL;  // Silence spurious "may be used uninitialized" warnings
  uint16_t *tmp_right = NULL;
  uint16_t *const input16 = CONVERT_TO_SHORTPTR(input);
  uint16_t *const in_tl = input16 - border_cols;
  uint16_t *const in_tr = input16 + width;
  if (pad_left) {
    tmp_left = (uint16_t *)aom_malloc(sizeof(*tmp_left) * border_cols * height);
    if (!tmp_left) return false;
    for (int i = 0; i < height; i++) {
      memcpy(tmp_left + i * border_cols, in_tl + i * in_stride, border_size);
      aom_memset16(in_tl + i * in_stride, input16[i * in_stride], border_cols);
    }
  }
  if (pad_right) {
    tmp_right =
        (uint16_t *)aom_malloc(sizeof(*tmp_right) * border_cols * height);
    if (!tmp_right) {
      aom_free(tmp_left);
      return false;
    }
    for (int i = 0; i < height; i++) {
      memcpy(tmp_right + i * border_cols, in_tr + i * in_stride, border_size);
      aom_memset16(in_tr + i * in_stride, input16[i * in_stride + width - 1],
                   border_cols);
    }
  }

  av1_highbd_convolve_horiz_rs(CONVERT_TO_SHORTPTR(input - 1), in_stride,
                               CONVERT_TO_SHORTPTR(output), out_stride, width2,
                               height2, &av1_resize_filter_normative[0][0],
                               x0_qn, x_step_qn, bd);

  // Restore the left/right border pixels
  if (pad_left) {
    for (int i = 0; i < height; i++) {
      memcpy(in_tl + i * in_stride, tmp_left + i * border_cols, border_size);
    }
    aom_free(tmp_left);
  }
  if (pad_right) {
    for (int i = 0; i < height; i++) {
      memcpy(in_tr + i * in_stride, tmp_right + i * border_cols, border_size);
    }
    aom_free(tmp_right);
  }
  return true;
}